

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosMath.cpp
# Opt level: O0

BlockDivisionInfo *
adios2::helper::DivideBlock(Dims *count,size_t subblockSize,BlockDivisionMethod divisionMethod)

{
  ulong uVar1;
  ushort uVar2;
  uint16_t uVar3;
  size_type sVar4;
  size_t sVar5;
  ulong uVar6;
  ostream *this;
  const_reference pvVar7;
  reference pvVar8;
  BlockDivisionMethod in_ECX;
  ulong in_RDX;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RSI;
  BlockDivisionInfo *in_RDI;
  uint16_t div;
  size_t dim;
  uint16_t n;
  size_t i;
  size_t nBlocks64;
  size_t nElems;
  size_t ndim;
  BlockDivisionInfo *info;
  BlockDivisionInfo *in_stack_fffffffffffffec0;
  allocator *in_stack_fffffffffffffed8;
  BlockDivisionInfo *info_00;
  undefined6 in_stack_fffffffffffffef0;
  undefined2 in_stack_fffffffffffffef6;
  value_type vVar9;
  int in_stack_ffffffffffffff04;
  string *in_stack_ffffffffffffff08;
  undefined2 in_stack_ffffffffffffff10;
  undefined2 in_stack_ffffffffffffff12;
  undefined2 in_stack_ffffffffffffff14;
  undefined1 in_stack_ffffffffffffff16;
  undefined1 in_stack_ffffffffffffff17;
  string *in_stack_ffffffffffffff18;
  string *in_stack_ffffffffffffff20;
  undefined1 local_c9 [40];
  allocator local_a1;
  string local_a0 [39];
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [36];
  BlockDivisionMethod local_1c;
  ulong local_18;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_10;
  
  info_00 = in_RDI;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  if (in_ECX != Contiguous) {
    in_stack_fffffffffffffed8 = &local_41;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"Helper",in_stack_fffffffffffffed8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"adiosMath",&local_79);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a0,"DivideBlock",&local_a1);
    in_stack_fffffffffffffec0 = (BlockDivisionInfo *)local_c9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_c9 + 1),
               "adios2::helper::DivideBlock() only works with Contiguous division method",
               (allocator *)in_stack_fffffffffffffec0);
    Throw<std::invalid_argument>
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
               (string *)
               CONCAT17(in_stack_ffffffffffffff17,
                        CONCAT16(in_stack_ffffffffffffff16,
                                 CONCAT24(in_stack_ffffffffffffff14,
                                          CONCAT22(in_stack_ffffffffffffff12,
                                                   in_stack_ffffffffffffff10)))),
               in_stack_ffffffffffffff08,in_stack_ffffffffffffff04);
    std::__cxx11::string::~string((string *)(local_c9 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_c9);
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(local_10);
  sVar5 = GetTotalSize((Dims *)in_RDI,(size_t)in_stack_fffffffffffffed8);
  uVar6 = sVar5 / local_18;
  if (uVar6 * local_18 < sVar5) {
    uVar6 = uVar6 + 1;
  }
  if (0x1000 < uVar6) {
    this = std::operator<<((ostream *)&std::cerr,
                           "ADIOS WARNING: The StatsBlockSize parameter is causing a data block to be divided up to more than 4096 sub-blocks.  This is an artificial limit to avoid metadata explosion."
                          );
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    uVar6 = 0x1000;
  }
  uVar3 = (uint16_t)uVar6;
  BlockDivisionInfo::BlockDivisionInfo(in_stack_fffffffffffffec0);
  in_RDI->SubBlockSize = local_18;
  in_RDI->DivisionMethod = local_1c;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
             CONCAT26(in_stack_fffffffffffffef6,in_stack_fffffffffffffef0),(size_type)info_00,
             (value_type_conflict8 *)in_RDI);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
             CONCAT26(in_stack_fffffffffffffef6,in_stack_fffffffffffffef0),(size_type)info_00,
             (value_type_conflict8 *)in_RDI);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
             CONCAT26(in_stack_fffffffffffffef6,in_stack_fffffffffffffef0),(size_type)info_00,
             (value_type_conflict8 *)in_RDI);
  in_RDI->NBlocks = uVar3;
  if (in_RDI->NBlocks == 0) {
    in_RDI->NBlocks = 1;
  }
  if (1 < in_RDI->NBlocks) {
    uVar3 = in_RDI->NBlocks;
    vVar9 = 1;
    for (uVar6 = 0; 1 < uVar3 && uVar6 < sVar4; uVar6 = uVar6 + 1) {
      pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (local_10,uVar6);
      uVar1 = *pvVar7;
      if (uVar3 < uVar1) {
        uVar2 = uVar3;
        uVar3 = 1;
      }
      else {
        uVar2 = (ushort)uVar1;
        uVar3 = (uint16_t)(uVar3 / uVar1);
      }
      vVar9 = uVar2;
      pvVar8 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                         (&in_RDI->Div,uVar6);
      *pvVar8 = uVar2;
    }
    CalculateSubblockInfo((Dims *)CONCAT26(vVar9,in_stack_fffffffffffffef0),info_00);
  }
  return info_00;
}

Assistant:

BlockDivisionInfo DivideBlock(const Dims &count, const size_t subblockSize,
                              const BlockDivisionMethod divisionMethod)
{
    if (divisionMethod != BlockDivisionMethod::Contiguous)
    {
        helper::Throw<std::invalid_argument>("Helper", "adiosMath", "DivideBlock",
                                             "adios2::helper::DivideBlock() only "
                                             "works with Contiguous division method");
    }
    const size_t ndim = count.size();
    const size_t nElems = helper::GetTotalSize(count);
    size_t nBlocks64 = nElems / subblockSize;
    if (nElems > nBlocks64 * subblockSize)
    {
        ++nBlocks64;
    }
    if (nBlocks64 > 4096)
    {
        std::cerr << "ADIOS WARNING: The StatsBlockSize parameter is causing a "
                     "data block to be divided up to more than 4096 sub-blocks. "
                     " This is an artificial limit to avoid metadata explosion."
                  << std::endl;
        nBlocks64 = 4096;
    }

    BlockDivisionInfo info;
    info.SubBlockSize = subblockSize;
    info.DivisionMethod = divisionMethod;
    info.Div.resize(ndim, 1);
    info.Rem.resize(ndim, 0);
    info.ReverseDivProduct.resize(ndim, 1);
    info.NBlocks = static_cast<uint16_t>(nBlocks64);
    if (info.NBlocks == 0)
    {
        info.NBlocks = 1;
    }

    if (info.NBlocks > 1)
    {
        /* Split the block into 'nBlocks' subblocks */
        /* FIXME: What about column-major dimension order here? */
        size_t i = 0;
        uint16_t n = info.NBlocks;
        size_t dim;
        uint16_t div = 1;
        while (n > 1 && i < ndim)
        {
            dim = count[i];
            if (n < dim)
            {
                div = n;
                n = 1;
            }
            else
            {
                div = static_cast<uint16_t>(dim);
                n = static_cast<uint16_t>(n / dim); // calming VS++
            }
            info.Div[i] = div;
            ++i;
        }
        CalculateSubblockInfo(count, info);
    }
    return info;
}